

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QLocaleId __thiscall QLocaleId::withLikelySubtagsAdded(QLocaleId *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  undefined8 uVar6;
  QLocaleId *key;
  QLocaleId *pQVar7;
  uint in_EDX;
  ulong uVar8;
  uint in_R8D;
  ulong uVar9;
  ushort in_R9W;
  uint uVar10;
  uint uVar11;
  difference_type __d;
  ulong uVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  
  uVar1 = this->language_id;
  if (uVar1 == 0) {
    pQVar7 = likely_subtags;
  }
  else {
    in_EDX._0_2_ = this->language_id;
    in_EDX._2_2_ = this->script_id;
    in_R8D = in_EDX & 0xffff;
    in_R9W = 0;
    if ((in_EDX & 0xffff) == 0) {
      in_R8D = 0x10000;
    }
    uVar10 = (uint)this->territory_id;
    if (this->territory_id == 0) {
      uVar10 = 0x10000;
    }
    pQVar7 = likely_subtags;
    uVar9 = 0x315;
    do {
      uVar12 = uVar9 >> 1;
      uVar8 = *(ulong *)(pQVar7 + uVar12 * 2);
      uVar11 = 0x10000;
      if ((uVar8 & 0xffff) != 0) {
        uVar11 = (uint)uVar8 & 0xffff;
      }
      bVar14 = uVar11 < in_R8D;
      if (uVar11 == in_R8D) {
        uVar11 = 0x10000;
        if ((uVar8 & 0xffff00000000) != 0) {
          uVar11 = (uint)(uVar8 >> 0x20) & 0xffff;
        }
        bVar14 = uVar11 < uVar10;
        if (uVar11 == uVar10) {
          bVar14 = (((uint)(uVar8 >> 0x10) & 0xffff) < in_EDX >> 0x10 || in_EDX < 0x10000) &&
                   0xffff < (uint)uVar8;
        }
      }
      if (bVar14) {
        pQVar7 = pQVar7 + uVar12 * 2 + 2;
        uVar12 = ~uVar12 + uVar9;
      }
      uVar9 = uVar12;
    } while (0 < (long)uVar12);
    if (pQVar7 < "en") {
      uVar2 = this->script_id;
      uVar3 = this->territory_id;
      do {
        if (pQVar7->language_id != uVar1) break;
        uVar4 = pQVar7->territory_id;
        bVar14 = true;
        if ((uVar4 == uVar3 || uVar4 == 0) &&
           (uVar5 = pQVar7->script_id, uVar5 == uVar2 || uVar5 == 0)) {
          in_R8D = (uint)pQVar7[1].territory_id;
          if (uVar4 == 0) {
            in_R8D = (uint)uVar3;
          }
          if (uVar3 == 0) {
            in_R8D = (uint)pQVar7[1].territory_id;
          }
          in_EDX = (uint)pQVar7[1].script_id;
          if (uVar5 == 0) {
            in_EDX = (uint)uVar2;
          }
          in_R9W = pQVar7[1].language_id;
          if (uVar2 == 0) {
            in_EDX = (uint)pQVar7[1].script_id;
          }
          bVar14 = false;
        }
        if (!bVar14) goto LAB_00120e8a;
        pQVar7 = pQVar7 + 2;
      } while (pQVar7 < "en");
    }
  }
  uVar2 = this->territory_id;
  uVar10 = (uint)uVar2;
  if (uVar2 != 0) {
    uVar3 = this->script_id;
    uVar11 = (uint)uVar3;
    if (0 < (long)"en" - (long)pQVar7) {
      uVar9 = ((ulong)((long)"en" - (long)pQVar7) >> 2) * -0x5555555555555555;
      do {
        uVar12 = uVar9 >> 1;
        uVar8 = *(ulong *)(pQVar7 + uVar12 * 2);
        bVar14 = (short)uVar8 != 0;
        if (!bVar14) {
          uVar13 = 0x10000;
          if ((uVar8 & 0xffff00000000) != 0) {
            uVar13 = (uint)(uVar8 >> 0x20) & 0xffff;
          }
          bVar14 = uVar13 < uVar10;
          if (uVar13 == uVar10) {
            bVar14 = (((uint)(uVar8 >> 0x10) & 0xffff) < uVar11 || uVar3 == 0) &&
                     0xffff < (uint)uVar8;
          }
        }
        if (bVar14) {
          pQVar7 = pQVar7 + uVar12 * 2 + 2;
          uVar12 = ~uVar12 + uVar9;
        }
        uVar9 = uVar12;
      } while (0 < (long)uVar12);
    }
    for (; (pQVar7 < "en" && (pQVar7->territory_id == uVar2)); pQVar7 = pQVar7 + 2) {
      uVar4 = pQVar7->script_id;
      if (uVar4 == uVar3 || uVar4 == 0) {
        in_R9W = uVar1;
        if (uVar1 == 0) {
          in_R9W = pQVar7[1].language_id;
        }
        in_EDX = uVar11;
        if (uVar4 != 0) {
          in_EDX = (uint)pQVar7[1].script_id;
        }
        in_R8D = (uint)pQVar7[1].territory_id;
        if (uVar11 == 0) {
          in_EDX = (uint)pQVar7[1].script_id;
        }
      }
      if (uVar4 == uVar3 || uVar4 == 0) goto LAB_00120e8a;
    }
  }
  uVar3 = this->script_id;
  in_EDX = (uint)uVar3;
  if (uVar3 == 0) {
    in_EDX = 0x42;
  }
  else {
    if (0 < (long)"en" - (long)pQVar7) {
      uVar9 = ((ulong)((long)"en" - (long)pQVar7) >> 2) * -0x5555555555555555;
      do {
        uVar8 = uVar9 >> 1;
        uVar6 = *(undefined8 *)(pQVar7 + uVar8 * 2);
        bVar14 = (short)uVar6 != 0;
        if ((!bVar14) && (bVar15 = (short)((ulong)uVar6 >> 0x20) == 0, bVar14 = !bVar15, bVar15)) {
          bVar14 = ((uint)((ulong)uVar6 >> 0x10) & 0xffff) < (uint)uVar3 && 0xffff < (uint)uVar6;
        }
        if (bVar14) {
          pQVar7 = pQVar7 + uVar8 * 2 + 2;
          uVar8 = ~uVar8 + uVar9;
        }
        uVar9 = uVar8;
      } while (0 < (long)uVar8);
    }
    if ((pQVar7 <= (QLocaleId *)((long)&likely_subtags[0x629].territory_id + 1)) &&
       (in_EDX = (uint)uVar3, pQVar7->script_id == uVar3)) {
      in_R9W = uVar1;
      if (uVar1 == 0) {
        in_R9W = pQVar7[1].language_id;
      }
      if (uVar10 == 0) {
        uVar2 = pQVar7[1].territory_id;
      }
      in_EDX = (uint)pQVar7[1].script_id;
      in_R8D = (uint)uVar2;
      goto LAB_00120e8a;
    }
  }
  in_R9W = 0x4b;
  if (uVar1 != 0) {
    in_R9W = uVar1;
  }
  in_R8D = 0xf8;
  if (uVar10 != 0) {
    in_R8D = uVar10;
  }
LAB_00120e8a:
  return (QLocaleId)((uint6)in_R9W | (uint6)(in_EDX << 0x10) | (uint6)(in_R8D & 0xffff) << 0x20);
}

Assistant:

QLocaleId QLocaleId::withLikelySubtagsAdded() const noexcept
{
    /* Each pattern that appears in a comments below, language_script_region and
       similar, indicates which of this's fields (even if blank) are being
       attended to in a given search; for fields left out of the pattern, the
       search uses 0 regardless of whether this has specified the field.

       If a key matches what we're searching for (possibly with a wildcard in
       the key matching a non-wildcard in our search), the tags from this that
       are specified in the key are replaced by the match (even if different);
       but the other tags of this replace what's in the match (even when the
       match does specify a value).

       Keep QLocaleXmlReader.__fillLikely() in sync with this, to ensure
       locale-appropriate time-zone naming works correctly.
    */
    static_assert(std::size(likely_subtags) % 2 == 0);
    auto *pairs = reinterpret_cast<const LikelyPair *>(likely_subtags);
    auto *const afterPairs = pairs + std::size(likely_subtags) / 2;
    LikelyPair sought { *this };
    // Our array is sorted in the order that puts all candidate matches in the
    // order we would want them; ones we should prefer appear before the others.
    if (language_id) {
        // language_script_region, language_region, language_script, language:
        pairs = std::lower_bound(pairs, afterPairs, sought);
        // Single language's block isn't long enough to warrant more binary
        // chopping within it - just traverse it all:
        for (; pairs < afterPairs && pairs->key.language_id == language_id; ++pairs) {
            const QLocaleId &key = pairs->key;
            if (key.territory_id && key.territory_id != territory_id)
                continue;
            if (key.script_id && key.script_id != script_id)
                continue;
            QLocaleId value = pairs->value;
            if (territory_id && !key.territory_id)
                value.territory_id = territory_id;
            if (script_id && !key.script_id)
                value.script_id = script_id;
            return value;
        }
    }
    // und_script_region or und_region (in that order):
    if (territory_id) {
        sought.key = QLocaleId { 0, script_id, territory_id };
        pairs = std::lower_bound(pairs, afterPairs, sought);
        // Again, individual und_?_region block isn't long enough to make binary
        // chop a win:
        for (; pairs < afterPairs && pairs->key.territory_id == territory_id; ++pairs) {
            const QLocaleId &key = pairs->key;
            Q_ASSERT(!key.language_id);
            if (key.script_id && key.script_id != script_id)
                continue;
            QLocaleId value = pairs->value;
            if (language_id)
                value.language_id = language_id;
            if (script_id && !key.script_id)
                value.script_id = script_id;
            return value;
        }
    }
    // und_script:
    if (script_id) {
        sought.key = QLocaleId { 0, script_id, 0 };
        pairs = std::lower_bound(pairs, afterPairs, sought);
        if (pairs < afterPairs && pairs->key.script_id == script_id) {
            Q_ASSERT(!pairs->key.language_id && !pairs->key.territory_id);
            QLocaleId value = pairs->value;
            if (language_id)
                value.language_id = language_id;
            if (territory_id)
                value.territory_id = territory_id;
            return value;
        }
    }
    // Finally, fall back to the match-all rule (if there is one):
    pairs = afterPairs - 1; // All other keys are < match-all.
    if (pairs->key.matchesAll()) {
        QLocaleId value = pairs->value;
        if (language_id)
            value.language_id = language_id;
        if (territory_id)
            value.territory_id = territory_id;
        if (script_id)
            value.script_id = script_id;
        return value;
    }
    return *this;
}